

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4ec2e9::BNTest_SetGetU64_Test::TestBody(BNTest_SetGetU64_Test *this)

{
  unsigned_long *lhs;
  _Head_base<0UL,_bignum_st_*,_false> a;
  int iVar1;
  BIGNUM *r;
  BIGNUM *a_00;
  long lVar2;
  char *pcVar3;
  _Head_base<0UL,_bignum_st_*,_false> in_R9;
  ScopedTrace gtest_trace_1722;
  uint64_t tmp_1;
  uint64_t tmp;
  UniquePtr<BIGNUM> bn;
  Message local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  AssertHelper local_80;
  ScopedTrace local_71;
  AssertHelper local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Head_base<0UL,_bignum_st_*,_false> local_48;
  _Head_base<0UL,_bignum_st_*,_false> local_40;
  AssertHelper local_38;
  
  lVar2 = 8;
  do {
    pcVar3 = *(char **)((long)&PTR_typeinfo_006d5eb8 + lVar2);
    testing::ScopedTrace::ScopedTrace
              (&local_71,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x6ba,pcVar3);
    local_40._M_head_impl = (bignum_st *)BN_new();
    local_48._M_head_impl = (bignum_st *)0x0;
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_40._M_head_impl != (BIGNUM *)0x0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_40._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,(AssertionResult *)0x53c60c,"false","true"
                 ,(char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6bc,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
LAB_002b8815:
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_68 != (undefined1  [8])&local_58) {
        operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
      }
LAB_002b892a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.data_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_70.data_ + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
      testing::ScopedTrace::~ScopedTrace(&local_71);
      return;
    }
    iVar1 = BN_set_u64(local_40._M_head_impl,
                       *(uint64_t *)((long)&TestBody::kU64Tests[0].hex + lVar2));
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,
                 (AssertionResult *)"BN_set_u64(bn.get(), test.value)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6bd,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      goto LAB_002b8815;
    }
    local_68 = (undefined1  [8])0x0;
    iVar1 = BN_hex2bn((BIGNUM **)local_68,pcVar3);
    a._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (bignum_st *)local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)a._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      BN_free((BIGNUM *)a._M_head_impl);
    }
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,
                 (AssertionResult *)"HexToBIGNUM(&expected, test.hex)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6be,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      goto LAB_002b8815;
    }
    in_R9._M_head_impl = local_40._M_head_impl;
    AssertBIGNUMSEqual((char *)local_68,"expected.get()","bn.get()","BN_set_u64",
                       local_48._M_head_impl,local_40._M_head_impl);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message(&local_90);
      pcVar3 = "";
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6bf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if ((long *)CONCAT71(local_90.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_90.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_90.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_90.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    iVar1 = BN_get_u64(local_40._M_head_impl,(uint64_t *)&local_70);
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,
                 (AssertionResult *)"BN_get_u64(bn.get(), &tmp)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6c2,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
LAB_002b8900:
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      local_70.data_ = local_80.data_;
      if (local_68 != (undefined1  [8])&local_58) {
        operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
        local_70.data_ = local_80.data_;
      }
      goto LAB_002b892a;
    }
    lhs = (unsigned_long *)((long)&TestBody::kU64Tests[0].hex + lVar2);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_68,"test.value","tmp",lhs,(unsigned_long *)&local_70);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message(&local_90);
      pcVar3 = "";
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6c3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)CONCAT71(local_90.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_90.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_90.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_90.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    BN_set_negative((BIGNUM *)local_40._M_head_impl,1);
    iVar1 = BN_get_u64(local_40._M_head_impl,(uint64_t *)&local_70);
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,
                 (AssertionResult *)"BN_get_u64(bn.get(), &tmp)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6c7,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
      goto LAB_002b8900;
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_68,"test.value","tmp",lhs,(unsigned_long *)&local_70);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message(&local_90);
      pcVar3 = "";
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6c8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)CONCAT71(local_90.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_90.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_90.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_90.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
    testing::ScopedTrace::~ScopedTrace(&local_71);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x58);
  r = BN_new();
  local_90.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(r != (BIGNUM *)0x0);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_head_impl = (bignum_st *)r;
  if (r == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_90,(AssertionResult *)0x53c60c,"false","true",
               (char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x6cd,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
LAB_002b8a3c:
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    local_70.data_ = (AssertHelperData *)local_48._M_head_impl;
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
      local_70.data_ = (AssertHelperData *)local_48._M_head_impl;
    }
  }
  else {
    a_00 = BN_value_one();
    iVar1 = BN_lshift(r,a_00,0x40);
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_48);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,
                 (AssertionResult *)"BN_lshift(bn.get(), BN_value_one(), 64)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6ce,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      goto LAB_002b8a3c;
    }
    iVar1 = BN_get_u64(local_40._M_head_impl,(uint64_t *)&local_48);
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 == 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_90.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_90,
                 (AssertionResult *)"BN_get_u64(bn.get(), &tmp)","true","false",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6d1,(char *)local_68);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_68 != (undefined1  [8])&local_58) {
        operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.data_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_70.data_ + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
    BN_set_negative((BIGNUM *)local_40._M_head_impl,1);
    iVar1 = BN_get_u64(local_40._M_head_impl,(uint64_t *)&local_48);
    local_90.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 == 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_90.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_) goto LAB_002b8a83;
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_90,
               (AssertionResult *)"BN_get_u64(bn.get(), &tmp)","true","false",
               (char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x6d4,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.data_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_70.data_ + 8))();
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
LAB_002b8a83:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST_F(BNTest, SetGetU64) {
  static const struct {
    const char *hex;
    uint64_t value;
  } kU64Tests[] = {
      {"0", UINT64_C(0x0)},
      {"1", UINT64_C(0x1)},
      {"ffffffff", UINT64_C(0xffffffff)},
      {"100000000", UINT64_C(0x100000000)},
      {"ffffffffffffffff", UINT64_C(0xffffffffffffffff)},
  };

  for (const auto &test : kU64Tests) {
    SCOPED_TRACE(test.hex);
    bssl::UniquePtr<BIGNUM> bn(BN_new()), expected;
    ASSERT_TRUE(bn);
    ASSERT_TRUE(BN_set_u64(bn.get(), test.value));
    ASSERT_TRUE(HexToBIGNUM(&expected, test.hex));
    EXPECT_BIGNUMS_EQUAL("BN_set_u64", expected.get(), bn.get());

    uint64_t tmp;
    ASSERT_TRUE(BN_get_u64(bn.get(), &tmp));
    EXPECT_EQ(test.value, tmp);

    // BN_get_u64 ignores the sign bit.
    BN_set_negative(bn.get(), 1);
    ASSERT_TRUE(BN_get_u64(bn.get(), &tmp));
    EXPECT_EQ(test.value, tmp);
  }

  // Test that BN_get_u64 fails on large numbers.
  bssl::UniquePtr<BIGNUM> bn(BN_new());
  ASSERT_TRUE(bn);
  ASSERT_TRUE(BN_lshift(bn.get(), BN_value_one(), 64));

  uint64_t tmp;
  EXPECT_FALSE(BN_get_u64(bn.get(), &tmp));

  BN_set_negative(bn.get(), 1);
  EXPECT_FALSE(BN_get_u64(bn.get(), &tmp));
}